

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

xmlSaveCtxtPtr xmlNewSaveCtxt(char *encoding,int options)

{
  int code;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar1;
  char *in_RCX;
  
  ctxt = (xmlSaveCtxtPtr)(*xmlMalloc)(0x90);
  if (ctxt == (xmlSaveCtxtPtr)0x0) {
    ctxt = (xmlSaveCtxtPtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                        (xmlError *)0x0);
  }
  else {
    memset(ctxt,0,0x90);
    if (encoding != (char *)0x0) {
      code = xmlOpenCharEncodingHandler(encoding,1,&ctxt->handler);
      if (code != 0) {
        xmlSaveErr((xmlOutputBufferPtr)0x0,code,(xmlNodePtr)encoding,in_RCX);
        xmlFreeSaveCtxt(ctxt);
        return (xmlSaveCtxtPtr)0x0;
      }
      pxVar1 = xmlStrdup((xmlChar *)encoding);
      ctxt->encoding = pxVar1;
    }
    xmlSaveCtxtInit(ctxt,options);
  }
  return ctxt;
}

Assistant:

static xmlSaveCtxtPtr
xmlNewSaveCtxt(const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = (xmlSaveCtxtPtr) xmlMalloc(sizeof(xmlSaveCtxt));
    if (ret == NULL) {
	xmlSaveErrMemory(NULL);
	return ( NULL );
    }
    memset(ret, 0, sizeof(xmlSaveCtxt));

    if (encoding != NULL) {
        int res;

        res = xmlOpenCharEncodingHandler(encoding, /* output */ 1,
                                         &ret->handler);
	if (res != XML_ERR_OK) {
	    xmlSaveErr(NULL, res, NULL, encoding);
            xmlFreeSaveCtxt(ret);
	    return(NULL);
	}
        ret->encoding = xmlStrdup((const xmlChar *)encoding);
    }

    xmlSaveCtxtInit(ret, options);

    return(ret);
}